

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::ExpressionVarVisitor::visit<slang::ast::StreamingConcatenationExpression>
          (ExpressionVarVisitor *this,StreamingConcatenationExpression *expr)

{
  uint uVar1;
  Symbol *pSVar2;
  
  if (((expr->super_Expression).kind & ~IntegerLiteral) == NamedValue) {
    pSVar2 = Expression::getSymbolReference(&expr->super_Expression,true);
    if (((pSVar2 != (Symbol *)0x0) && (uVar1 = pSVar2->kind - Variable, uVar1 < 0x19)) &&
       ((0x1800c0fU >> (uVar1 & 0x1f) & 1) != 0)) {
      this->anyVars = true;
    }
    return;
  }
  StreamingConcatenationExpression::visitExprs<slang::ast::ExpressionVarVisitor&>(expr,this);
  return;
}

Assistant:

void visit(const T& expr) {
        if constexpr (std::is_base_of_v<Expression, T>) {
            switch (expr.kind) {
                case ExpressionKind::NamedValue:
                case ExpressionKind::HierarchicalValue: {
                    if (auto sym = expr.getSymbolReference()) {
                        if (VariableSymbol::isKind(sym->kind))
                            anyVars = true;
                    }
                    break;
                }
                default:
                    if constexpr (HasVisitExprs<T, ExpressionVarVisitor>) {
                        expr.visitExprs(*this);
                    }
                    break;
            }
        }
    }